

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  pointer pLVar1;
  Index IVar2;
  Offset OVar3;
  Result RVar4;
  
  IVar2 = num_func_imports(this);
  this->func_ = (this->module_->funcs).
                super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
                _M_impl.super__Vector_impl_data._M_start + (index - IVar2);
  OVar3 = Istream::end(this->istream_);
  this->func_->code_offset = OVar3;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)&this->depth_fixups_);
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index - IVar2);
  RVar4 = SharedValidator::BeginFunctionBody
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     index);
  if (RVar4.enum_ != Error) {
    PushLabel(this,0xffffffff,0xffffffff);
  }
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(loc, index));

  // Push implicit func label (equivalent to return).
  PushLabel();
  return Result::Ok;
}